

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timeline.hpp
# Opt level: O3

microseconds __thiscall ableton::link::Timeline::fromBeats(Timeline *this,Beats *beats)

{
  long lVar1;
  long lVar2;
  longlong lVar3;
  
  lVar1 = (beats->super_tuple<long>).super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>
          ._M_head_impl;
  lVar2 = (this->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
          super__Head_base<0UL,_long,_false>._M_head_impl;
  lVar3 = llround(60000000.0 /
                  (this->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
                  super__Head_base<0UL,_double,_false>._M_head_impl);
  lVar3 = llround((double)lVar3 * ((double)(lVar1 - lVar2) / 1000000.0));
  return (microseconds)(lVar3 + (this->timeOrigin).__r);
}

Assistant:

std::chrono::microseconds fromBeats(const Beats beats) const
  {
    return timeOrigin + tempo.beatsToMicros(beats - beatOrigin);
  }